

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoadGeometryStages::GenTCS<tcu::Vector<int,4>>
          (string *__return_storage_ptr__,BasicAllFormatsLoadGeometryStages *this,
          GLenum internalformat,Vector<int,_4> *expected_value)

{
  ostream *poVar1;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream os;
  Vector<int,_4> *expected_value_local;
  GLenum internalformat_local;
  BasicAllFormatsLoadGeometryStages *this_local;
  
  os._368_8_ = expected_value;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,
                           "#version 420 core\nlayout(vertices = 1) out;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1d0,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,") readonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_1f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,
                           "image2DArray g_image1;\nlayout(rgba32f) writeonly uniform image2D g_image1_result;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);\n  "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_210,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"vec4 v = imageLoad(g_image1, coord);\n  if (v != ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
            (&local_230,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<int,_4> *)os._368_8_);
  std::operator<<(poVar1,
                  ") imageStore(g_image1_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));\n  else imageStore(g_image1_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));\n}"
                 );
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTCS(GLenum internalformat, const T& expected_value)
	{
		std::ostringstream os;
		os << "#version 420 core" NL "layout(vertices = 1) out;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") readonly uniform " << TypePrefix<T>()
		   << "image2DArray g_image1;" NL "layout(rgba32f) writeonly uniform image2D g_image1_result;" NL
			  "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL "  gl_TessLevelInner[1] = 1;" NL
			  "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL "  gl_TessLevelOuter[2] = 1;" NL
			  "  gl_TessLevelOuter[3] = 1;" NL "  ivec3 coord = ivec3(gl_PrimitiveID, 0, 0);" NL "  "
		   << TypePrefix<T>() << "vec4 v = imageLoad(g_image1, coord);" NL "  if (v != " << TypePrefix<T>() << "vec4"
		   << expected_value << ") imageStore(g_image1_result, coord.xy, vec4(1.0, 0.0, 0.0, 1.0));" NL
								"  else imageStore(g_image1_result, coord.xy, vec4(0.0, 1.0, 0.0, 1.0));" NL "}";
		return os.str();
	}